

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-death-test.cc
# Opt level: O3

void __thiscall testing::internal::DeathTestImpl::~DeathTestImpl(DeathTestImpl *this)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  undefined8 extraout_RAX;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  undefined8 uVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  string local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  string local_78;
  int local_54;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  (this->super_DeathTest)._vptr_DeathTest = (_func_int **)&PTR__DeathTestImpl_00167898;
  if (this->read_fd_ == -1) {
    return;
  }
  local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"CHECK failed: File ","");
  pbVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     (&local_f8,
                      "/workspace/llm4binary/github/license_c_cmakelists/Abc-Arbitrage[P]fixpp/googletest-release-1.8.0/googletest/src/gtest-death-test.cc"
                     );
  local_98._M_dataplus._M_p = (pbVar1->_M_dataplus)._M_p;
  paVar2 = &pbVar1->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p == paVar2) {
    local_98.field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
    local_98.field_2._8_8_ = *(undefined8 *)((long)&pbVar1->field_2 + 8);
    local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  }
  else {
    local_98.field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
  }
  local_98._M_string_length = pbVar1->_M_string_length;
  (pbVar1->_M_dataplus)._M_p = (pointer)paVar2;
  pbVar1->_M_string_length = 0;
  (pbVar1->field_2)._M_local_buf[0] = '\0';
  pbVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     (&local_98,", line ");
  local_50._M_dataplus._M_p = (pbVar1->_M_dataplus)._M_p;
  paVar2 = &pbVar1->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p == paVar2) {
    local_50.field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
    local_50.field_2._8_8_ = *(undefined8 *)((long)&pbVar1->field_2 + 8);
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  }
  else {
    local_50.field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
  }
  local_50._M_string_length = pbVar1->_M_string_length;
  (pbVar1->_M_dataplus)._M_p = (pointer)paVar2;
  pbVar1->_M_string_length = 0;
  (pbVar1->field_2)._M_local_buf[0] = '\0';
  local_54 = 0x181;
  StreamableToString<int>(&local_78,&local_54);
  uVar3 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    uVar3 = local_50.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar3 < local_78._M_string_length + local_50._M_string_length) {
    uVar3 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      uVar3 = local_78.field_2._M_allocated_capacity;
    }
    if (local_78._M_string_length + local_50._M_string_length <= (ulong)uVar3) {
      pbVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               replace(&local_78,0,0,local_50._M_dataplus._M_p,local_50._M_string_length);
      goto LAB_0014df3b;
    }
  }
  pbVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
           _M_append(&local_50,local_78._M_dataplus._M_p,local_78._M_string_length);
LAB_0014df3b:
  local_30._M_dataplus._M_p = (pbVar1->_M_dataplus)._M_p;
  paVar2 = &pbVar1->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p == paVar2) {
    local_30.field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
    local_30.field_2._8_8_ = *(undefined8 *)((long)&pbVar1->field_2 + 8);
    local_30._M_dataplus._M_p = (pointer)&local_30.field_2;
  }
  else {
    local_30.field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
  }
  local_30._M_string_length = pbVar1->_M_string_length;
  (pbVar1->_M_dataplus)._M_p = (pointer)paVar2;
  pbVar1->_M_string_length = 0;
  paVar2->_M_local_buf[0] = '\0';
  pbVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     (&local_30,": ");
  local_b8._M_dataplus._M_p = (pbVar1->_M_dataplus)._M_p;
  paVar2 = &pbVar1->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p == paVar2) {
    local_b8.field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
    local_b8.field_2._8_8_ = *(undefined8 *)((long)&pbVar1->field_2 + 8);
    local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
  }
  else {
    local_b8.field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
  }
  local_b8._M_string_length = pbVar1->_M_string_length;
  (pbVar1->_M_dataplus)._M_p = (pointer)paVar2;
  pbVar1->_M_string_length = 0;
  (pbVar1->field_2)._M_local_buf[0] = '\0';
  pbVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     (&local_b8,"read_fd_ == -1");
  local_d8._M_dataplus._M_p = (pbVar1->_M_dataplus)._M_p;
  paVar2 = &pbVar1->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p == paVar2) {
    local_d8.field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
    local_d8.field_2._8_8_ = *(undefined8 *)((long)&pbVar1->field_2 + 8);
    local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
  }
  else {
    local_d8.field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
  }
  local_d8._M_string_length = pbVar1->_M_string_length;
  (pbVar1->_M_dataplus)._M_p = (pointer)paVar2;
  pbVar1->_M_string_length = 0;
  (pbVar1->field_2)._M_local_buf[0] = '\0';
  DeathTestAbort(&local_d8);
  __clang_call_terminate(extraout_RAX);
}

Assistant:

~DeathTestImpl() { GTEST_DEATH_TEST_CHECK_(read_fd_ == -1); }